

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O2

QWidget * QApplication::topLevelAt(QPoint *pos)

{
  Data *pDVar1;
  QObject *object;
  QWidgetWindow *pQVar2;
  
  object = (QObject *)QGuiApplication::topLevelAt(pos);
  if ((((object != (QObject *)0x0) &&
       (pQVar2 = QtPrivate::qobject_cast_helper<QWidgetWindow_const*,QObject_const>(object),
       pQVar2 != (QWidgetWindow *)0x0)) && (pDVar1 = (pQVar2->m_widget).wp.d, pDVar1 != (Data *)0x0)
      ) && (*(int *)(pDVar1 + 4) != 0)) {
    return (QWidget *)(pQVar2->m_widget).wp.value;
  }
  return (QWidget *)0x0;
}

Assistant:

QWidget *QApplication::topLevelAt(const QPoint &pos)
{
    if (const QWindow *window = QGuiApplication::topLevelAt(pos)) {
        if (const QWidgetWindow *widgetWindow = qobject_cast<const QWidgetWindow *>(window))
            return widgetWindow->widget();
    }
    return nullptr;
}